

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.c
# Opt level: O2

void duckdb_je_rtree_ctx_data_init(rtree_ctx_t *ctx)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 0x10) {
    *(undefined8 *)((long)&ctx->cache[0].leafkey + lVar1) = 1;
    *(undefined8 *)((long)&ctx->cache[0].leaf + lVar1) = 0;
  }
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x10) {
    *(undefined8 *)((long)&ctx->l2_cache[0].leafkey + lVar1) = 1;
    *(undefined8 *)((long)&ctx->l2_cache[0].leaf + lVar1) = 0;
  }
  return;
}

Assistant:

void
rtree_ctx_data_init(rtree_ctx_t *ctx) {
	for (unsigned i = 0; i < RTREE_CTX_NCACHE; i++) {
		rtree_ctx_cache_elm_t *cache = &ctx->cache[i];
		cache->leafkey = RTREE_LEAFKEY_INVALID;
		cache->leaf = NULL;
	}
	for (unsigned i = 0; i < RTREE_CTX_NCACHE_L2; i++) {
		rtree_ctx_cache_elm_t *cache = &ctx->l2_cache[i];
		cache->leafkey = RTREE_LEAFKEY_INVALID;
		cache->leaf = NULL;
	}
}